

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O0

void __thiscall vector_<char>::push_back(vector_<char> *this,char *val)

{
  char cVar1;
  type pcVar2;
  char *val_local;
  vector_<char> *this_local;
  
  if (this->capacity < this->_size + 1) {
    resize(this);
  }
  cVar1 = *val;
  pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[](&this->arr,this->_size)
  ;
  *pcVar2 = cVar1;
  this->_size = this->_size + 1;
  return;
}

Assistant:

void push_back(const T &val) {
        if (_size + 1 > capacity) {
            resize();
        }

        arr[_size] = val;
        ++_size;
    }